

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_comment(p_ply ply)

{
  int iVar1;
  char *in_RDI;
  p_ply in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp(in_RDI + *(long *)(in_RDI + 0x2050) + 0x48,"comment");
  if (iVar1 == 0) {
    iVar1 = ply_read_line(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = ply_add_comment((p_ply)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = ply_read_word(in_stack_ffffffffffffffe8);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          iVar1 = 1;
        }
      }
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int ply_read_header_comment(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "comment")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_comment(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}